

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  bool bVar3;
  longlong lVar4;
  longlong lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i *palVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  __m128i *ptr;
  int32_t *ptr_00;
  ulong uVar16;
  ulong extraout_RDX;
  longlong lVar17;
  longlong extraout_RDX_01;
  ulong extraout_RDX_02;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  ulong uVar18;
  longlong extraout_XMM0_Qb_07;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i alVar19;
  __m128i alVar20;
  __m128i alVar21;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffa48;
  ulong local_5b0;
  int local_5a4;
  ulong local_5a0;
  int local_594;
  long local_590;
  int local_588;
  int local_580;
  int local_57c;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m128i vCompare;
  int32_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t e;
  __m128i_32_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int32_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  longlong extraout_RDX_00;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse2_128_32",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse2_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse2_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_striped_profile_sse2_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse2_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_striped_profile_sse2_128_32",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_striped_profile_sse2_128_32",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_striped_profile_sse2_128_32",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar11 = (iVar1 + 3) / 4;
    uVar12 = ~((iVar1 + -1) / iVar11);
    iVar13 = uVar12 + 4;
    if (-open < ppVar2->min) {
      local_57c = open + -0x80000000;
    }
    else {
      local_57c = -0x80000000 - ppVar2->min;
    }
    local_57c = local_57c + 1;
    iVar14 = 0x7ffffffe - ppVar2->max;
    vMaxH[1] = CONCAT44(local_57c,local_57c);
    vMaxH[0] = CONCAT44(local_57c,local_57c);
    vSaturationCheckMax[1] = CONCAT44(iVar14,iVar14);
    vSaturationCheckMin[0] = CONCAT44(iVar14,iVar14);
    result._0_4_ = -(uint)(iVar13 == 3);
    result._4_4_ = -(uint)(iVar13 == 2);
    vPosMask[0]._0_4_ = -(uint)(iVar13 == 1);
    vPosMask[0]._4_4_ = -(uint)(uVar12 == 0xfffffffc);
    iVar15 = s1_beg;
    vPosMask[1] = vMaxH[1];
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar11 * 4,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x4400802;
      uVar12 = 0;
      if (s1_beg != 0) {
        uVar12 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar12 | *(uint *)&_segNum->field_0xc;
      uVar12 = 0;
      if (s1_end != 0) {
        uVar12 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar12 | *(uint *)&_segNum->field_0xc;
      uVar12 = 0;
      if (s2_beg != 0) {
        uVar12 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar12 | *(uint *)&_segNum->field_0xc;
      uVar12 = 0;
      if (s2_end != 0) {
        uVar12 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar12 | *(uint *)&_segNum->field_0xc;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar11);
      pvE = parasail_memalign___m128i(0x10,(long)iVar11);
      ptr = parasail_memalign___m128i(0x10,(long)iVar11);
      alVar21[0] = (size_t)(s2Len + 1);
      ptr_00 = parasail_memalign_int32_t(0x10,alVar21[0]);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.v[3] = 0;
        uVar16 = extraout_RDX;
        for (k = 0; k < iVar11; k = k + 1) {
          for (h.v[2] = 0; h.v[2] < 4; h.v[2] = h.v[2] + 1) {
            if (s1_beg == 0) {
              uVar12 = h.v[2] * iVar11 + k;
              uVar16 = (ulong)uVar12;
              local_580 = -(gap * uVar12) - open;
            }
            else {
              local_580 = 0;
            }
            local_588 = local_580;
            if ((long)local_580 < -0x80000000) {
              local_588 = -0x80000000;
            }
            *(int *)((long)&e + (long)h.v[2] * 4 + 8) = local_588;
            local_590 = (long)local_580 - (long)open;
            if (local_590 < -0x80000000) {
              local_590 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)h.v[2] * 4) = (int)local_590;
          }
          pvHLoad[h.v[3]][0] = e.m[1];
          pvHLoad[h.v[3]][1] = h.m[0];
          ptr[h.v[3]][0] = tmp;
          ptr[h.v[3]][1] = e.m[0];
          h.v[3] = h.v[3] + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_594 = -(gap * (k + -1)) - open;
          }
          else {
            local_594 = 0;
          }
          local_5a0 = (ulong)local_594;
          if ((long)local_5a0 < -0x80000000) {
            local_5a0 = 0xffffffff80000000;
          }
          uVar16 = local_5a0 & 0xffffffff;
          ptr_00[k] = (int32_t)local_5a0;
        }
        vSaturationCheckMax[0] = vMaxH[0];
        for (s1Len = 0; palVar10 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          pvE = pvHLoad;
          pvHLoad = palVar10;
          uVar16 = (ulong)s1Len;
          alVar20[0] = (int *)(ulong)(uint)ptr_00[uVar16];
          alVar21[0] = 0;
          alVar20[1] = 0;
          alVar19 = _mm_insert_epi32_rpl(alVar20,(uint)(byte)s2[s1Len],s1Len);
          lVar17 = alVar19[1];
          alVar19[0] = alVar20[0];
          for (k = 0; k < iVar11; k = k + 1) {
            b[1] = (long)k * 0x10;
            a[1] = alVar21[0];
            a[0] = (longlong)alVar19[0];
            b[0] = lVar17;
            alVar20 = _mm_max_epi32_rpl(a,b);
            b_00[0] = alVar20[1];
            a_00[1] = alVar21[0];
            a_00[0] = (longlong)alVar19[0];
            b_00[1] = b[1];
            alVar20 = _mm_max_epi32_rpl(a_00,b_00);
            b_01[0] = alVar20[1];
            b_01[1] = (long)k * 0x10;
            palVar10[k][0] = extraout_XMM0_Qa;
            palVar10[k][1] = extraout_XMM0_Qb;
            a_01[1] = alVar21[0];
            a_01[0] = (longlong)alVar19[0];
            alVar20 = _mm_max_epi32_rpl(a_01,b_01);
            b_02[0] = alVar20[1];
            a_02[1] = alVar21[0];
            a_02[0] = (longlong)alVar19[0];
            b_02[1] = b_01[1];
            alVar20 = _mm_min_epi32_rpl(a_02,b_02);
            b_03[0] = alVar20[1];
            a_03[1] = alVar21[0];
            a_03[0] = (longlong)alVar19[0];
            b_03[1] = b_01[1];
            alVar20 = _mm_min_epi32_rpl(a_03,b_03);
            b_04[0] = alVar20[1];
            a_04[1] = alVar21[0];
            a_04[0] = (longlong)alVar19[0];
            b_04[1] = b_01[1];
            _mm_min_epi32_rpl(a_04,b_04);
            alVar19[0] = ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                         rowcols->score_row;
            vH_00[0] = (size_t)(uint)k;
            uVar16 = (ulong)(uint)s1Len;
            vH_00[1]._0_4_ = iVar11;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(alVar19[0],vH_00,s1Len,s2Len,iVar15,in_stack_fffffffffffffa48);
            a_05[1] = vH_00[0];
            a_05[0] = (longlong)alVar19[0];
            b_05[1] = uVar16;
            b_05[0] = extraout_RDX_00;
            alVar21 = _mm_max_epi32_rpl(a_05,b_05);
            b_06[0] = alVar21[1];
            b_06[1] = (long)k * 0x10;
            ptr[k][0] = extraout_XMM0_Qa_02;
            ptr[k][1] = extraout_XMM0_Qb_02;
            a_06[1] = vH_00[0];
            a_06[0] = (longlong)alVar19[0];
            alVar21 = _mm_max_epi32_rpl(a_06,b_06);
            lVar17 = alVar21[1];
            uVar16 = (long)k * 0x10;
            alVar21[0] = vH_00[0];
            vMaxH[1] = extraout_XMM0_Qa_00;
            vSaturationCheckMax[0] = extraout_XMM0_Qb_00;
            vSaturationCheckMax[1] = extraout_XMM0_Qa_01;
            vSaturationCheckMin[0] = extraout_XMM0_Qb_01;
          }
          for (end_query = 0; end_query < 4; end_query = end_query + 1) {
            if (s2_beg == 0) {
              uVar16 = (ulong)(s1Len + 1);
              local_5a4 = ptr_00[uVar16] - open;
            }
            else {
              local_5a4 = -open;
            }
            local_5b0 = (ulong)local_5a4;
            if ((long)local_5b0 < -0x80000000) {
              local_5b0 = 0xffffffff80000000;
            }
            alVar19[0] = (int *)(local_5b0 & 0xffffffff);
            alVar21[0] = 0;
            alVar19[1] = 0;
            alVar20 = _mm_insert_epi32_rpl(alVar19,(int32_t)lVar17,(int)uVar16);
            lVar17 = alVar20[1];
            vH[1] = extraout_XMM0_Qa_03;
            vF[0] = extraout_XMM0_Qb_03;
            for (k = 0; k < iVar11; k = k + 1) {
              b_07[1] = (long)k * 0x10;
              a_07[1] = alVar21[0];
              a_07[0] = (longlong)alVar19[0];
              b_07[0] = lVar17;
              alVar20 = _mm_max_epi32_rpl(a_07,b_07);
              b_08[0] = alVar20[1];
              b_08[1] = (long)k * 0x10;
              palVar10[k][0] = extraout_XMM0_Qa_04;
              palVar10[k][1] = extraout_XMM0_Qb_04;
              a_08[1] = alVar21[0];
              a_08[0] = (longlong)alVar19[0];
              alVar20 = _mm_min_epi32_rpl(a_08,b_08);
              b_09[0] = alVar20[1];
              a_09[1] = alVar21[0];
              a_09[0] = (longlong)alVar19[0];
              b_09[1] = b_08[1];
              _mm_max_epi32_rpl(a_09,b_09);
              alVar19[0] = ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                           rowcols->score_row;
              alVar21[0] = (size_t)(uint)k;
              uVar16 = (ulong)(uint)s1Len;
              alVar21[1]._0_4_ = iVar11;
              alVar21[1]._4_4_ = 0;
              arr_store_si128(alVar19[0],alVar21,s1Len,s2Len,iVar15,in_stack_fffffffffffffa48);
              local_188 = (int)extraout_XMM0_Qa_04;
              iStack_184 = (int)((ulong)extraout_XMM0_Qa_04 >> 0x20);
              iStack_180 = (int)extraout_XMM0_Qb_04;
              iStack_17c = (int)((ulong)extraout_XMM0_Qb_04 >> 0x20);
              local_1a8 = (int)vH[1];
              iStack_1a4 = (int)((ulong)vH[1] >> 0x20);
              iStack_1a0 = (int)vF[0];
              iStack_19c = (int)((ulong)vF[0] >> 0x20);
              iStack_19c = iStack_19c - gap;
              vH[1] = CONCAT44(iStack_1a4 - gap,local_1a8 - gap);
              vF[0] = CONCAT44(iStack_19c,iStack_1a0 - gap);
              bVar3 = iStack_17c - open < iStack_19c;
              uVar12 = -(uint)bVar3;
              auVar9._4_4_ = -(uint)(iStack_184 - open < iStack_1a4 - gap);
              auVar9._0_4_ = -(uint)(local_188 - open < local_1a8 - gap);
              auVar9._8_4_ = -(uint)(iStack_180 - open < iStack_1a0 - gap);
              auVar9._12_4_ = uVar12;
              lVar17 = extraout_RDX_01;
              vMaxH[1] = extraout_XMM0_Qa_06;
              vSaturationCheckMax[0] = extraout_XMM0_Qb_06;
              vSaturationCheckMax[1] = extraout_XMM0_Qa_05;
              vSaturationCheckMin[0] = extraout_XMM0_Qb_05;
              if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar9 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar9 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar9 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar9 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar9 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar9 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar9 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar9 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar9 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar9 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (uVar12 >> 7 & 1) == 0) && (uVar12 >> 0xf & 1) == 0) &&
                  (uVar12 >> 0x17 & 1) == 0) && !bVar3) goto LAB_006b717e;
            }
          }
LAB_006b717e:
          b[1] = (long)((iVar1 + -1) % iVar11);
          b_10[1] = b[1] * 0x10;
          lVar4 = palVar10[b[1]][0];
          lVar5 = palVar10[b[1]][1];
          uVar6 = CONCAT44(result._4_4_,(int)result);
          local_b8 = (int)lVar4;
          iStack_b4 = (int)((ulong)lVar4 >> 0x20);
          iStack_b0 = (int)lVar5;
          iStack_ac = (int)((ulong)lVar5 >> 0x20);
          local_c8 = (int)vPosMask[1];
          iStack_c4 = (int)((ulong)vPosMask[1] >> 0x20);
          iStack_c0 = (int)vMaxH[0];
          iStack_bc = (int)((ulong)vMaxH[0] >> 0x20);
          uVar18 = CONCAT44(vPosMask[0]._4_4_,(int)vPosMask[0]) &
                   CONCAT44(-(uint)(iStack_bc < iStack_ac),-(uint)(iStack_c0 < iStack_b0));
          a_10[1] = alVar21[0];
          a_10[0] = (longlong)alVar19[0];
          b_10[0] = lVar17;
          alVar20 = _mm_max_epi32_rpl(a_10,b_10);
          uVar16 = alVar20[1];
          auVar8._8_8_ = uVar18;
          auVar8._0_8_ = uVar6 & CONCAT44(-(uint)(iStack_c4 < iStack_b4),
                                          -(uint)(local_c8 < local_b8));
          if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar18 >> 7 & 1) != 0) || (uVar18 >> 0xf & 1) != 0) ||
                  (uVar18 >> 0x17 & 1) != 0) || (uVar18 >> 0x1f & 1) != 0) ||
                (uVar18 >> 0x27 & 1) != 0) || (uVar18 >> 0x2f & 1) != 0) ||
              (uVar18 >> 0x37 & 1) != 0) || (long)uVar18 < 0) {
            matrix._0_4_ = s1Len;
          }
          vPosMask[1] = extraout_XMM0_Qa_07;
          vMaxH[0] = extraout_XMM0_Qb_07;
        }
        vNegLimit[1]._4_4_ = local_57c;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar13; end_query = end_query + 1) {
            vPosMask[1] = vPosMask[1] << 0x20;
          }
          a_11[1] = alVar21[0];
          a_11[0] = 3;
          vNegLimit[1]._4_4_ = _mm_extract_epi32_rpl(a_11,(int)uVar16);
          uVar16 = extraout_RDX_02;
        }
        matrix._4_4_ = iVar1 + -1;
        iVar15 = (int)uVar16;
        if (s1_end != 0) {
          _temp = pvHLoad;
          for (k = 0; iVar15 = (int)uVar16, k < iVar11 * 4; k = k + 1) {
            uVar12 = (k % 4) * iVar11;
            uVar16 = (ulong)uVar12;
            iVar15 = k / 4 + uVar12;
            if (iVar15 < iVar1) {
              if (vNegLimit[1]._4_4_ < (int)(*_temp)[0]) {
                vNegLimit[1]._4_4_ = (int)(*_temp)[0];
                matrix._0_4_ = s2Len + -1;
                matrix._4_4_ = iVar15;
              }
              else if ((((int)(*_temp)[0] == vNegLimit[1]._4_4_) && ((int)matrix == s2Len + -1)) &&
                      (iVar15 < matrix._4_4_)) {
                matrix._4_4_ = iVar15;
              }
            }
            _temp = (__m128i *)((long)*_temp + 4);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          for (end_query = 0; end_query < iVar13; end_query = end_query + 1) {
          }
          a_12[1] = alVar21[0];
          a_12[0] = 3;
          vNegLimit[1]._4_4_ = _mm_extract_epi32_rpl(a_12,iVar15);
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
        }
        local_28 = (int)vSaturationCheckMax[1];
        iStack_24 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_20 = (int)vSaturationCheckMin[0];
        iStack_1c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_d8 = (int)vMaxH[1];
        iStack_d4 = (int)((ulong)vMaxH[1] >> 0x20);
        iStack_d0 = (int)vSaturationCheckMax[0];
        iStack_cc = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar16 = CONCAT44(-(uint)(iStack_1c < local_57c),-(uint)(iStack_20 < local_57c)) |
                 CONCAT44(-(uint)(iVar14 < iStack_cc),-(uint)(iVar14 < iStack_d0));
        auVar7._8_8_ = uVar16;
        auVar7._0_8_ = CONCAT44(-(uint)(iStack_24 < local_57c),-(uint)(local_28 < local_57c)) |
                       CONCAT44(-(uint)(iVar14 < iStack_d4),-(uint)(iVar14 < local_d8));
        if ((((((((((((((((auVar7 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar7 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar7 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar7 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar7 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar7 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar16 >> 7 & 1) != 0) || (uVar16 >> 0xf & 1) != 0) || (uVar16 >> 0x17 & 1) != 0)
               || (uVar16 >> 0x1f & 1) != 0) || (uVar16 >> 0x27 & 1) != 0) ||
             (uVar16 >> 0x2f & 1) != 0) || (uVar16 >> 0x37 & 1) != 0) || (long)uVar16 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          vNegLimit[1]._4_4_ = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = vNegLimit[1]._4_4_;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (int)matrix;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32_rpl(vH, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}